

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O3

feed_db_status_t setup_feed_db(feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  feed_db_status_t fVar3;
  char *error_msg;
  char sql [3157];
  char *local_c80;
  char local_c78 [3168];
  
  memcpy(local_c78,
         "CREATE TABLE agency ( \tagency_id TEXT, \tagency_name TEXT PRIMARY KEY NOT NULL, \tagency_url TEXT NOT NULL, \tagency_timezone TEXT NOT NULL, \tagency_lang TEXT, \tagency_phone TEXT, \tagency_fare_url TEXT, \tagency_email TEXT );\nCREATE TABLE stops ( \tstop_id TEXT PRIMARY KEY NOT NULL, \tstop_code TEXT, \tstop_name TEXT NOT NULL, \tstop_desc TEXT, \tstop_lat DOUBLE NOT NULL, \tstop_lon DOUBLE NOT NULL, \tzone_id TEXT, \tstop_url TEXT, \tlocation_type INT, \tparent_station TEXT, \tstop_timezone TEXT, \twheelchair_boarding INT,    level_id TEXT,    platform_code TEXT );\nCREATE TABLE routes ( \troute_id TEXT PRIMARY KEY NOT NULL, \tagency_id TEXT, \troute_short_name TEXT, \troute_long_name TEXT, \troute_desc TEXT, \troute_type INT NOT NULL, \troute_url TEXT, \troute_color TEXT, \troute_text_color TEXT, \troute_sort_order INT );\nCREATE TABLE trips ( \troute_id TEXT NOT NULL, \tservice_id TEXT NOT NULL, \ttrip_id TEXT PRIMARY KEY NOT NULL, \ttrip_headsign TEXT, \ttrip_short_name TEXT, \tdirection_id INT, \tblock_id TEXT, \tshape_id TEXT, \twheelchair_accessible INT, \tbikes_allowed INT );\nCREATE TABLE stop_times ( \ttrip_id TEXT NOT NULL, \tarrival_time TEXT NOT NULL, \tdeparture_time TEXT NOT NULL, \tstop_id TEXT NOT NULL, \tstop_sequence INT NOT NULL, \tstop_headsign TEXT, \tpickup_type INT, \tdrop_off_type INT, \tshape_dist_traveled REAL, \ttimepoint INT );\nCREATE TABLE calendar ( \tservice_id TEXT PRIMARY KEY NOT NULL, \tmonday INT NOT NULL, \ttuesday INT NOT NULL, \twednesday INT NOT NULL, \tthursday INT NOT NULL, \tfriday INT NOT NULL, \tsaturday INT NOT NULL, \tsunday INT NOT NULL, \tstart_date TEXT NOT NULL, \tend_date TEXT NOT NULL );\nCREATE TABLE calendar_dates ( \tservice_id TEXT NOT NULL, \tdate TEXT NOT NULL, \texception_type INT NOT NULL );\nCREATE TABLE fare_attributes ( \tfare_id TEXT NOT NULL, \tprice REAL NOT NULL, \tcurrency_type TEXT NOT NULL, \tpayment_method INT NOT NULL, \ttransfers INT NOT NULL, \tagency_id TEXT, \ttransfer_duration REAL );\nCREATE TABLE fare_rules ( \tfare_id TEXT NOT NULL, \troute_id TEXT, \torigin_id TEXT, \tdestination_id TEXT, \tcontains_id TEXT )..." /* TRUNCATED STRING LITERAL */
         ,0xc55);
  iVar1 = sqlite3_exec(db->conn,local_c78,(sqlite3_callback)0x0,(void *)0x0,&local_c80);
  db->rc = iVar1;
  if (iVar1 == 0) {
    fVar3 = FEED_DB_SUCCESS;
  }
  else {
    fVar3 = FEED_DB_ERROR;
    if (local_c80 != (char *)0x0) {
      pcVar2 = strdup(local_c80);
      db->error_msg = pcVar2;
      sqlite3_free(local_c80);
      fVar3 = FEED_DB_ERROR;
    }
  }
  return fVar3;
}

Assistant:

feed_db_status_t setup_feed_db(feed_db_t *db) {
    char sql[] = ""
        "CREATE TABLE agency ( "
        "	agency_id TEXT, "
        "	agency_name TEXT PRIMARY KEY NOT NULL, "
        "	agency_url TEXT NOT NULL, "
        "	agency_timezone TEXT NOT NULL, "
        "	agency_lang TEXT, "
        "	agency_phone TEXT, "
        "	agency_fare_url TEXT, "
        "	agency_email TEXT "
        ");\n"
        "CREATE TABLE stops ( "
        "	stop_id TEXT PRIMARY KEY NOT NULL, "
        "	stop_code TEXT, "
        "	stop_name TEXT NOT NULL, "
        "	stop_desc TEXT, "
        "	stop_lat DOUBLE NOT NULL, "
        "	stop_lon DOUBLE NOT NULL, "
        "	zone_id TEXT, "
        "	stop_url TEXT, "
        "	location_type INT, "
        "	parent_station TEXT, "
        "	stop_timezone TEXT, "
        "	wheelchair_boarding INT, "
        "   level_id TEXT, "
        "   platform_code TEXT "
        ");\n"
        "CREATE TABLE routes ( "
        "	route_id TEXT PRIMARY KEY NOT NULL, "
        "	agency_id TEXT, "
        "	route_short_name TEXT, "
        "	route_long_name TEXT, "
        "	route_desc TEXT, "
        "	route_type INT NOT NULL, "
        "	route_url TEXT, "
        "	route_color TEXT, "
        "	route_text_color TEXT, "
        "	route_sort_order INT "
        ");\n"
        "CREATE TABLE trips ( "
        "	route_id TEXT NOT NULL, "
        "	service_id TEXT NOT NULL, "
        "	trip_id TEXT PRIMARY KEY NOT NULL, "
        "	trip_headsign TEXT, "
        "	trip_short_name TEXT, "
        "	direction_id INT, "
        "	block_id TEXT, "
        "	shape_id TEXT, "
        "	wheelchair_accessible INT, "
        "	bikes_allowed INT "
        ");\n"
        "CREATE TABLE stop_times ( "
        "	trip_id TEXT NOT NULL, "
        "	arrival_time TEXT NOT NULL, "
        "	departure_time TEXT NOT NULL, "
        "	stop_id TEXT NOT NULL, "
        "	stop_sequence INT NOT NULL, "
        "	stop_headsign TEXT, "
        "	pickup_type INT, "
        "	drop_off_type INT, "
        "	shape_dist_traveled REAL, "
        "	timepoint INT "
        ");\n"
        "CREATE TABLE calendar ( "
        "	service_id TEXT PRIMARY KEY NOT NULL, "
        "	monday INT NOT NULL, "
        "	tuesday INT NOT NULL, "
        "	wednesday INT NOT NULL, "
        "	thursday INT NOT NULL, "
        "	friday INT NOT NULL, "
        "	saturday INT NOT NULL, "
        "	sunday INT NOT NULL, "
        "	start_date TEXT NOT NULL, "
        "	end_date TEXT NOT NULL "
        ");\n"
        "CREATE TABLE calendar_dates ( "
        "	service_id TEXT NOT NULL, "
        "	date TEXT NOT NULL, "
        "	exception_type INT NOT NULL "
        ");\n"
        "CREATE TABLE fare_attributes ( "
        "	fare_id TEXT NOT NULL, "
        "	price REAL NOT NULL, "
        "	currency_type TEXT NOT NULL, "
        "	payment_method INT NOT NULL, "
        "	transfers INT NOT NULL, "
        "	agency_id TEXT, "
        "	transfer_duration REAL "
        ");\n"
        "CREATE TABLE fare_rules ( "
        "	fare_id TEXT NOT NULL, "
        "	route_id TEXT, "
        "	origin_id TEXT, "
        "	destination_id TEXT, "
        "	contains_id TEXT "
        ");\n"
        "CREATE TABLE shapes ( "
        "	shape_id TEXT NOT NULL, "
        "	shape_pt_lat DOUBLE NOT NULL, "
        "	shape_pt_lon DOUBLE NOT NULL, "
        "	shape_pt_sequence INT NOT NULL, "
        "	shape_dist_traveled REAL "
        ");\n"
        "CREATE TABLE frequencies ( "
        "	trip_id TEXT NOT NULL, "
        "	start_time TEXT NOT NULL, "
        "	end_time TEXT NOT NULL, "
        "	headway_secs INT NOT NULL, "
        "	exact_times INT "
        ");\n"
        "CREATE TABLE transfers ( "
        "	from_stop_id TEXT NOT NULL, "
        "	to_stop_id TEXT NOT NULL, "
        "	transfer_type INT NOT NULL, "
        "	min_transfer_time INT "
        ");\n"
        "CREATE TABLE feed_info ( "
        "	feed_publisher_name TEXT NOT NULL, "
        "	feed_publisher_url TEXT NOT NULL, "
        "	feed_lang TEXT NOT NULL, "
        "	feed_start_date TEXT, "
        "	feed_end_date TEXT, "
        "	feed_version TEXT, "
        "	feed_contact_email TEXT, "
        "	feed_contact_url TEXT "
        ");\n"
        "CREATE TABLE levels ( "
        "	level_id TEXT NOT NULL, "
        "	level_index DOUBLE NOT NULL, "
        "	level_name TEXT "
        ");\n"
        "CREATE TABLE pathways ( "
        "	pathway_id TEXT NOT NULL, "
        "	from_stop_id TEXT NOT NULL, "
        "	to_stop_id TEXT NOT NULL, "
        "	pathway_mode INT NOT NULL, "
        "	is_bidirectional INT NOT NULL, "
        "	length DOUBLE, "
        "	traversal_time INT, "
        "	stair_count INT, "
        "	max_slope DOUBLE, "
        "	min_width DOUBLE, "
        "	signposted_as TEXT, "
        "	reversed_signposted_as TEXT "
        "); ";

    char *error_msg;
    db->rc = sqlite3_exec(db->conn, sql, NULL, NULL, &error_msg);

    if (db->rc) {
        if (error_msg != NULL) {
            db->error_msg = strdup(error_msg);
            sqlite3_free(error_msg);
        }
        return FEED_DB_ERROR;
    }

    return FEED_DB_SUCCESS;
}